

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewParseTest.cpp
# Opt level: O1

void __thiscall TApp_DefaultComplex_Test::TestBody(TApp_DefaultComplex_Test *this)

{
  App *app;
  bool bVar1;
  long lVar2;
  char *pcVar3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  cx comp;
  string help;
  AssertHelper local_1b0 [2];
  undefined1 local_1a0 [16];
  AssertHelper local_190;
  long local_188;
  undefined1 local_180 [16];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  _Alloc_hider local_168;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_160 [16];
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  char local_110 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  AssertHelperData *local_100;
  AssertHelperData *local_f8;
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0 [16];
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_100 = (AssertHelperData *)&DAT_3ff0000000000000;
  local_f8 = (AssertHelperData *)&DAT_4000000000000000;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"-c,--complex","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  app = &(this->super_TApp).app;
  add_option(app,&local_50,(cx *)&local_100,&local_70,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_170.ptr_ = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"-c","");
  local_150[0] = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"4","");
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"3","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,&local_170,local_110);
  lVar2 = 0;
  do {
    if (local_120 + lVar2 != *(undefined1 **)((long)local_130 + lVar2)) {
      operator_delete(*(undefined1 **)((long)local_130 + lVar2));
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x60);
  pcVar3 = "";
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"","");
  CLI::App::help(&local_90,app,0x1e,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  local_190.data_ = (AssertHelperData *)local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"1","");
  local_170.ptr_ = local_160;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,local_190.data_,
             (undefined1 *)((long)&(local_190.data_)->type + local_188));
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_170.ptr_,local_168._M_p + (long)local_170.ptr_);
  if (local_170.ptr_ != local_160) {
    operator_delete(local_170.ptr_);
  }
  local_170.ptr_ = local_160;
  std::__cxx11::string::_M_construct<char*>((string *)&local_170,local_d0,local_d0 + local_c8);
  local_1b0[0].data_ = (AssertHelperData *)local_1a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1b0,local_170.ptr_,local_168._M_p + (long)local_170.ptr_);
  if (local_170.ptr_ != local_160) {
    operator_delete(local_170.ptr_);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_110,(char *)local_1b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x13c36e);
  if (local_1b0[0].data_ != (AssertHelperData *)local_1a0) {
    operator_delete(local_1b0[0].data_);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_190.data_ != (AssertHelperData *)local_180) {
    operator_delete(local_190.data_);
  }
  if (local_110[0] == '\0') {
    testing::Message::Message((Message *)&local_170);
    if (local_108.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = ((local_108.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/NewParseTest.cpp"
               ,0x30,pcVar3);
    testing::internal::AssertHelper::operator=(local_1b0,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(local_1b0);
    if (local_170.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_170.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_170.ptr_ + 8))();
      }
      local_170.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_108,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_190.data_ = (AssertHelperData *)local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"2","");
  local_170.ptr_ = local_160;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,local_190.data_,
             (undefined1 *)((long)&(local_190.data_)->type + local_188));
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,local_170.ptr_,local_168._M_p + (long)local_170.ptr_);
  if (local_170.ptr_ != local_160) {
    operator_delete(local_170.ptr_);
  }
  local_170.ptr_ = local_160;
  std::__cxx11::string::_M_construct<char*>((string *)&local_170,local_f0,local_f0 + local_e8);
  local_1b0[0].data_ = (AssertHelperData *)local_1a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1b0,local_170.ptr_,local_168._M_p + (long)local_170.ptr_);
  if (local_170.ptr_ != local_160) {
    operator_delete(local_170.ptr_);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_110,(char *)local_1b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x13c36e);
  if (local_1b0[0].data_ != (AssertHelperData *)local_1a0) {
    operator_delete(local_1b0[0].data_);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_190.data_ != (AssertHelperData *)local_180) {
    operator_delete(local_190.data_);
  }
  if (local_110[0] == '\0') {
    testing::Message::Message((Message *)&local_170);
    if (local_108.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_108.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/NewParseTest.cpp"
               ,0x31,pcVar3);
    testing::internal::AssertHelper::operator=(local_1b0,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(local_1b0);
    if (local_170.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_170.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_170.ptr_ + 8))();
      }
      local_170.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_108,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_190.data_._0_4_ = 1;
  local_1b0[0].data_ = local_100;
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&local_170,"1","comp.real()",(int *)&local_190,(double *)local_1b0);
  if (local_170.ptr_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_1b0);
    if (local_168._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_168._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/NewParseTest.cpp"
               ,0x33,pcVar3);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_1b0[0].data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_1b0[0].data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_1b0[0].data_ + 8))();
      }
      local_1b0[0].data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_168,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_190.data_._0_4_ = 2;
  local_1b0[0].data_ = local_f8;
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&local_170,"2","comp.imag()",(int *)&local_190,(double *)local_1b0);
  if (local_170.ptr_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_1b0);
    if (local_168._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_168._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/NewParseTest.cpp"
               ,0x34,pcVar3);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_1b0[0].data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_1b0[0].data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_1b0[0].data_ + 8))();
      }
      local_1b0[0].data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_168,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  TApp::run(&this->super_TApp);
  local_190.data_._0_4_ = 4;
  local_1b0[0].data_ = local_100;
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&local_170,"4","comp.real()",(int *)&local_190,(double *)local_1b0);
  if (local_170.ptr_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_1b0);
    if (local_168._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_168._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/NewParseTest.cpp"
               ,0x38,pcVar3);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_1b0[0].data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_1b0[0].data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_1b0[0].data_ + 8))();
      }
      local_1b0[0].data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_168,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_190.data_._0_4_ = 3;
  local_1b0[0].data_ = local_f8;
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&local_170,"3","comp.imag()",(int *)&local_190,(double *)local_1b0);
  if (local_170.ptr_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_1b0);
    if (local_168._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_168._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/NewParseTest.cpp"
               ,0x39,pcVar3);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_1b0[0].data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_1b0[0].data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_1b0[0].data_ + 8))();
      }
      local_1b0[0].data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_168,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_F(TApp, DefaultComplex) {

    cx comp{1, 2};
    add_option(app, "-c,--complex", comp, "", true);
    args = {"-c", "4", "3"};

    std::string help = app.help();
    EXPECT_THAT(help, HasSubstr("1"));
    EXPECT_THAT(help, HasSubstr("2"));

    EXPECT_EQ(1, comp.real());
    EXPECT_EQ(2, comp.imag());

    run();

    EXPECT_EQ(4, comp.real());
    EXPECT_EQ(3, comp.imag());
}